

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_read_native_straddle(mpack_reader_t *reader,char *p,size_t count)

{
  mpack_error_t mVar1;
  size_t __n;
  size_t sVar2;
  size_t read;
  size_t left;
  size_t count_local;
  char *p_local;
  mpack_reader_t *reader_local;
  
  mVar1 = mpack_reader_error(reader);
  if (mVar1 == mpack_ok) {
    __n = (long)reader->end - (long)reader->data;
    if (reader->fill == (mpack_reader_fill_t)0x0) {
      mpack_reader_flag_error(reader,mpack_error_invalid);
      memset(p,0,count);
    }
    else if (reader->size == 0) {
      mpack_reader_flag_error(reader,mpack_error_io);
      memset(p,0,count);
    }
    else {
      left = count;
      count_local = (size_t)p;
      if (__n != 0) {
        memcpy(p,reader->data,__n);
        left = count - __n;
        count_local = (size_t)(p + __n);
        reader->data = reader->data + __n;
      }
      if (reader->size >> 5 < left) {
        mpack_fill_range(reader,(char *)count_local,left,left);
      }
      else {
        sVar2 = mpack_fill_range(reader,reader->buffer,left,reader->size);
        mVar1 = mpack_reader_error(reader);
        if (mVar1 == mpack_ok) {
          memcpy((void *)count_local,reader->buffer,left);
          reader->data = reader->buffer + left;
          reader->end = reader->buffer + sVar2;
        }
      }
    }
  }
  else {
    memset(p,0,count);
  }
  return;
}

Assistant:

MPACK_NOINLINE void mpack_read_native_straddle(mpack_reader_t* reader, char* p, size_t count) {
    mpack_assert(count == 0 || p != NULL, "data pointer for %i bytes is NULL", (int)count);

    if (mpack_reader_error(reader) != mpack_ok) {
        mpack_memset(p, 0, count);
        return;
    }

    size_t left = (size_t)(reader->end - reader->data);
    mpack_log("big read for %i bytes into %p, %i left in buffer, buffer size %i\n",
            (int)count, p, (int)left, (int)reader->size);

    if (count <= left) {
        mpack_assert(0,
                "big read requested for %i bytes, but there are %i bytes "
                "left in buffer. call mpack_read_native() instead",
                (int)count, (int)left);
        mpack_reader_flag_error(reader, mpack_error_bug);
        mpack_memset(p, 0, count);
        return;
    }

    // we'll need a fill function to get more data. if there's no
    // fill function, the buffer should contain an entire MessagePack
    // object, so we raise mpack_error_invalid instead of mpack_error_io
    // on truncated data.
    if (reader->fill == NULL) {
        mpack_reader_flag_error(reader, mpack_error_invalid);
        mpack_memset(p, 0, count);
        return;
    }

    if (reader->size == 0) {
        // somewhat debatable what error should be returned here. when
        // initializing a reader with an in-memory buffer it's not
        // necessarily a bug if the data is blank; it might just have
        // been truncated to zero. for this reason we return the same
        // error as if the data was truncated.
        mpack_reader_flag_error(reader, mpack_error_io);
        mpack_memset(p, 0, count);
        return;
    }

    // flush what's left of the buffer
    if (left > 0) {
        mpack_log("flushing %i bytes remaining in buffer\n", (int)left);
        mpack_memcpy(p, reader->data, left);
        count -= left;
        p += left;
        reader->data += left;
    }

    // if the remaining data needed is some small fraction of the
    // buffer size, we'll try to fill the buffer as much as possible
    // and copy the needed data out.
    if (count <= reader->size / MPACK_READER_SMALL_FRACTION_DENOMINATOR) {
        size_t read = mpack_fill_range(reader, reader->buffer, count, reader->size);
        if (mpack_reader_error(reader) != mpack_ok)
            return;
        mpack_memcpy(p, reader->buffer, count);
        reader->data = reader->buffer + count;
        reader->end = reader->buffer + read;

    // otherwise we read the remaining data directly into the target.
    } else {
        mpack_log("reading %i additional bytes\n", (int)count);
        mpack_fill_range(reader, p, count, count);
    }
}